

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O1

void __thiscall
icu_63::RegexCompile::compile(RegexCompile *this,UText *pat,UParseError *pp,UErrorCode *e)

{
  RegexPatternChar *c;
  int8_t *piVar1;
  int iVar2;
  RegexPattern *pRVar3;
  UnicodeSet **ppUVar4;
  byte bVar5;
  UBool UVar6;
  int32_t iVar7;
  UText *pUVar8;
  int64_t iVar9;
  UnicodeSet *pUVar10;
  Regex8BitSet *pRVar11;
  int32_t i;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  RegexPatternChar *p;
  size_t size;
  UMemory *this_00;
  long lVar15;
  long lVar16;
  bool bVar17;
  
  this->fStatus = e;
  this->fParseErr = pp;
  this->fStackPtr = 0;
  this->fStack[0] = 0;
  if (U_ZERO_ERROR < *e) {
    return;
  }
  pUVar8 = utext_clone_63(this->fRXPat->fPattern,pat,'\0','\x01',e);
  pRVar3 = this->fRXPat;
  pRVar3->fPattern = pUVar8;
  ppUVar4 = RegexStaticSets::gStaticSets;
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    pRVar3->fStaticSets = RegexStaticSets::gStaticSets;
    pRVar3->fStaticSets8 = (Regex8BitSet *)(ppUVar4 + 0xd);
    iVar9 = utext_nativeLength_63(pat);
    this->fPatternLength = iVar9;
    if ((this->fModeFlags & 0x10) != 0) {
      this->fQuoteMode = '\x01';
    }
    c = &this->fC;
    p = c;
    nextChar(this,c);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar13 = 1;
      do {
        puVar14 = (uint *)(gRuleParseStateTable + uVar13 * 8);
        bVar5 = gRuleParseStateTable[uVar13 * 8 + 4];
        bVar17 = (this->fC).fQuoted == '\0';
        uVar12 = (this->fC).fChar;
        if ((0x7e < bVar5 || !bVar17) || uVar12 != bVar5) {
          do {
            if (bVar5 == 0xfe) {
              if (!bVar17) break;
            }
            else if (bVar5 == 0xff) break;
            if ((bVar5 == 0xfd && uVar12 == 0xffffffff) ||
               (((bVar17 == true && (char)bVar5 < -0x10) && uVar12 != 0xffffffff &&
                (UVar6 = UnicodeSet::contains
                                   ((UnicodeSet *)
                                    (RegexStaticSets::gStaticSets +
                                    (ulong)(bVar5 & 0x7f) * 0xb + 0x41),uVar12), UVar6 != '\0'))))
            break;
            bVar5 = (byte)puVar14[3];
            puVar14 = puVar14 + 2;
            bVar17 = (this->fC).fQuoted == '\0';
            uVar12 = (this->fC).fChar;
            if (uVar12 == bVar5 && (bVar5 < 0x7f && bVar17)) break;
          } while( true );
        }
        p = (RegexPatternChar *)(ulong)*puVar14;
        UVar6 = doParseActions(this,*puVar14);
        if (UVar6 == '\0') break;
        bVar5 = *(byte *)((long)puVar14 + 6);
        if (bVar5 != 0) {
          iVar2 = this->fStackPtr;
          this->fStackPtr = iVar2 + 1;
          if (0x62 < iVar2) {
            p = (RegexPatternChar *)0x10300;
            error(this,U_REGEX_ERROR_START);
            this->fStackPtr = this->fStackPtr + -1;
          }
          this->fStack[this->fStackPtr] = (ushort)bVar5;
        }
        if (*(char *)((long)puVar14 + 7) != '\0') {
          p = c;
          nextChar(this,c);
        }
        uVar13 = (ulong)*(byte *)((long)puVar14 + 5);
        if (*(byte *)((long)puVar14 + 5) == 0xff) {
          iVar2 = this->fStackPtr;
          uVar13 = (ulong)this->fStack[iVar2];
          this->fStackPtr = iVar2 + -1;
          if ((long)iVar2 < 1) {
            this->fStackPtr = iVar2;
            p = (RegexPatternChar *)0x10306;
            error(this,U_REGEX_MISMATCHED_PAREN);
          }
        }
      } while (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR);
    }
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      allocateStackData(this,2);
      stripNOPs(this);
      size = 3;
      iVar7 = minMatchLength(this,3,this->fRXPat->fCompiledPat->count + -1);
      this->fRXPat->fMinMatchLen = iVar7;
      matchStartType(this);
      iVar2 = this->fRXPat->fSets->count;
      lVar15 = (long)iVar2;
      this_00 = (UMemory *)0xffffffffffffffff;
      if (-1 < lVar15) {
        this_00 = (UMemory *)(lVar15 << 5);
      }
      pRVar11 = (Regex8BitSet *)UMemory::operator_new__(this_00,size);
      if (pRVar11 == (Regex8BitSet *)0x0) {
        pRVar11 = (Regex8BitSet *)0x0;
      }
      else if (iVar2 != 0) {
        memset(pRVar11,0,(size_t)(lVar15 << 5));
      }
      this->fRXPat->fSets8 = pRVar11;
      if (pRVar11 == (Regex8BitSet *)0x0) {
        *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
        *e = U_MEMORY_ALLOCATION_ERROR;
      }
      else if (0 < iVar2) {
        lVar16 = 0;
        do {
          pUVar10 = (UnicodeSet *)UVector::elementAt(this->fRXPat->fSets,(int32_t)lVar16);
          if (pUVar10 != (UnicodeSet *)0x0) {
            pRVar11 = this->fRXPat->fSets8;
            uVar13 = 0;
            do {
              UVar6 = UnicodeSet::contains(pUVar10,(int)uVar13);
              if (UVar6 != '\0') {
                piVar1 = pRVar11[lVar16].d + (uVar13 >> 3);
                *piVar1 = *piVar1 | (byte)(1 << ((byte)uVar13 & 7));
              }
              uVar12 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar12;
            } while (uVar12 != 0x100);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != lVar15);
      }
    }
    else if ((this->fSetStack).super_UVector.count != 0) {
      do {
        pUVar10 = (UnicodeSet *)UStack::pop(&this->fSetStack);
        if (pUVar10 != (UnicodeSet *)0x0) {
          UnicodeSet::~UnicodeSet(pUVar10);
          UMemory::operator_delete((UMemory *)pUVar10,p);
        }
      } while ((this->fSetStack).super_UVector.count != 0);
    }
  }
  return;
}

Assistant:

void    RegexCompile::compile(
                         UText *pat,                 // Source pat to be compiled.
                         UParseError &pp,            // Error position info
                         UErrorCode &e)              // Error Code
{
    fStatus             = &e;
    fParseErr           = &pp;
    fStackPtr           = 0;
    fStack[fStackPtr]   = 0;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // There should be no pattern stuff in the RegexPattern object.  They can not be reused.
    U_ASSERT(fRXPat->fPattern == NULL || utext_nativeLength(fRXPat->fPattern) == 0);

    // Prepare the RegexPattern object to receive the compiled pattern.
    fRXPat->fPattern        = utext_clone(fRXPat->fPattern, pat, FALSE, TRUE, fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    fRXPat->fStaticSets     = RegexStaticSets::gStaticSets->fPropSets;
    fRXPat->fStaticSets8    = RegexStaticSets::gStaticSets->fPropSets8;


    // Initialize the pattern scanning state machine
    fPatternLength = utext_nativeLength(pat);
    uint16_t                state = 1;
    const RegexTableEl      *tableEl;

    // UREGEX_LITERAL force entire pattern to be treated as a literal string.
    if (fModeFlags & UREGEX_LITERAL) {
        fQuoteMode = TRUE;
    }

    nextChar(fC);                        // Fetch the first char from the pattern string.

    //
    // Main loop for the regex pattern parsing state machine.
    //   Runs once per state transition.
    //   Each time through optionally performs, depending on the state table,
    //      - an advance to the the next pattern char
    //      - an action to be performed.
    //      - pushing or popping a state to/from the local state return stack.
    //   file regexcst.txt is the source for the state table.  The logic behind
    //     recongizing the pattern syntax is there, not here.
    //
    for (;;) {
        //  Bail out if anything has gone wrong.
        //  Regex pattern parsing stops on the first error encountered.
        if (U_FAILURE(*fStatus)) {
            break;
        }

        U_ASSERT(state != 0);

        // Find the state table element that matches the input char from the pattern, or the
        //    class of the input character.  Start with the first table row for this
        //    state, then linearly scan forward until we find a row that matches the
        //    character.  The last row for each state always matches all characters, so
        //    the search will stop there, if not before.
        //
        tableEl = &gRuleParseStateTable[state];
        REGEX_SCAN_DEBUG_PRINTF(("char, line, col = (\'%c\', %d, %d)    state=%s ",
            fC.fChar, fLineNum, fCharNum, RegexStateNames[state]));

        for (;;) {    // loop through table rows belonging to this state, looking for one
                      //   that matches the current input char.
            REGEX_SCAN_DEBUG_PRINTF(("."));
            if (tableEl->fCharClass < 127 && fC.fQuoted == FALSE &&   tableEl->fCharClass == fC.fChar) {
                // Table row specified an individual character, not a set, and
                //   the input character is not quoted, and
                //   the input character matched it.
                break;
            }
            if (tableEl->fCharClass == 255) {
                // Table row specified default, match anything character class.
                break;
            }
            if (tableEl->fCharClass == 254 && fC.fQuoted)  {
                // Table row specified "quoted" and the char was quoted.
                break;
            }
            if (tableEl->fCharClass == 253 && fC.fChar == (UChar32)-1)  {
                // Table row specified eof and we hit eof on the input.
                break;
            }

            if (tableEl->fCharClass >= 128 && tableEl->fCharClass < 240 &&   // Table specs a char class &&
                fC.fQuoted == FALSE &&                                       //   char is not escaped &&
                fC.fChar != (UChar32)-1) {                                   //   char is not EOF
                U_ASSERT(tableEl->fCharClass <= 137);
                if (RegexStaticSets::gStaticSets->fRuleSets[tableEl->fCharClass-128].contains(fC.fChar)) {
                    // Table row specified a character class, or set of characters,
                    //   and the current char matches it.
                    break;
                }
            }

            // No match on this row, advance to the next  row for this state,
            tableEl++;
        }
        REGEX_SCAN_DEBUG_PRINTF(("\n"));

        //
        // We've found the row of the state table that matches the current input
        //   character from the rules string.
        // Perform any action specified  by this row in the state table.
        if (doParseActions(tableEl->fAction) == FALSE) {
            // Break out of the state machine loop if the
            //   the action signalled some kind of error, or
            //   the action was to exit, occurs on normal end-of-rules-input.
            break;
        }

        if (tableEl->fPushState != 0) {
            fStackPtr++;
            if (fStackPtr >= kStackSize) {
                error(U_REGEX_INTERNAL_ERROR);
                REGEX_SCAN_DEBUG_PRINTF(("RegexCompile::parse() - state stack overflow.\n"));
                fStackPtr--;
            }
            fStack[fStackPtr] = tableEl->fPushState;
        }

        //
        //  NextChar.  This is where characters are actually fetched from the pattern.
        //             Happens under control of the 'n' tag in the state table.
        //
        if (tableEl->fNextChar) {
            nextChar(fC);
        }

        // Get the next state from the table entry, or from the
        //   state stack if the next state was specified as "pop".
        if (tableEl->fNextState != 255) {
            state = tableEl->fNextState;
        } else {
            state = fStack[fStackPtr];
            fStackPtr--;
            if (fStackPtr < 0) {
                // state stack underflow
                // This will occur if the user pattern has mis-matched parentheses,
                //   with extra close parens.
                //
                fStackPtr++;
                error(U_REGEX_MISMATCHED_PAREN);
            }
        }

    }

    if (U_FAILURE(*fStatus)) {
        // Bail out if the pattern had errors.
        //   Set stack cleanup:  a successful compile would have left it empty,
        //   but errors can leave temporary sets hanging around.
        while (!fSetStack.empty()) {
            delete (UnicodeSet *)fSetStack.pop();
        }
        return;
    }

    //
    // The pattern has now been read and processed, and the compiled code generated.
    //

    //
    // The pattern's fFrameSize so far has accumulated the requirements for
    //   storage for capture parentheses, counters, etc. that are encountered
    //   in the pattern.  Add space for the two variables that are always
    //   present in the saved state:  the input string position (int64_t) and
    //   the position in the compiled pattern.
    //
    allocateStackData(RESTACKFRAME_HDRCOUNT);

    //
    // Optimization pass 1: NOPs, back-references, and case-folding
    //
    stripNOPs();

    //
    // Get bounds for the minimum and maximum length of a string that this
    //   pattern can match.  Used to avoid looking for matches in strings that
    //   are too short.
    //
    fRXPat->fMinMatchLen = minMatchLength(3, fRXPat->fCompiledPat->size()-1);

    //
    // Optimization pass 2: match start type
    //
    matchStartType();

    //
    // Set up fast latin-1 range sets
    //
    int32_t numSets = fRXPat->fSets->size();
    fRXPat->fSets8 = new Regex8BitSet[numSets];
    // Null pointer check.
    if (fRXPat->fSets8 == NULL) {
        e = *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    int32_t i;
    for (i=0; i<numSets; i++) {
        UnicodeSet *s = (UnicodeSet *)fRXPat->fSets->elementAt(i);
        fRXPat->fSets8[i].init(s);
    }

}